

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::DatePart::EpochOperator::PropagateStatistics<duckdb::dtime_t>
          (EpochOperator *this,ClientContext *context,FunctionStatisticsInput *input)

{
  reference stats;
  Value VStack_c8;
  LogicalType local_88;
  BaseStatistics result;
  
  LogicalType::LogicalType(&local_88,DOUBLE);
  NumericStats::CreateEmpty(&result,&local_88);
  LogicalType::~LogicalType(&local_88);
  stats = vector<duckdb::BaseStatistics,_true>::get<true>(input->child_stats,0);
  BaseStatistics::CopyValidity(&result,stats);
  Value::DOUBLE(&VStack_c8,0.0);
  NumericStats::SetMin(&result,&VStack_c8);
  Value::~Value(&VStack_c8);
  Value::DOUBLE(&VStack_c8,86400.0);
  NumericStats::SetMax(&result,&VStack_c8);
  Value::~Value(&VStack_c8);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&result);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> DatePart::EpochOperator::PropagateStatistics<dtime_t>(ClientContext &context,
                                                                                 FunctionStatisticsInput &input) {
	auto result = NumericStats::CreateEmpty(LogicalType::DOUBLE);
	result.CopyValidity(input.child_stats[0]);
	NumericStats::SetMin(result, Value::DOUBLE(0));
	NumericStats::SetMax(result, Value::DOUBLE(Interval::SECS_PER_DAY));
	return result.ToUnique();
}